

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cimgui.cpp
# Opt level: O0

void ImVector_ImVec2_resizeT(ImVector_ImVec2 *self,int new_size,ImVec2 v)

{
  int new_size_local;
  ImVector_ImVec2 *self_local;
  ImVec2 v_local;
  
  self_local = (ImVector_ImVec2 *)v;
  ImVector<ImVec2>::resize(self,new_size,(ImVec2 *)&self_local);
  return;
}

Assistant:

CIMGUI_API void ImVector_ImVec2_resizeT(ImVector_ImVec2* self,int new_size,const ImVec2 v)
{
    return self->resize(new_size,v);
}